

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

Vec3f __thiscall Model::normal(Model *this,int fi,int li)

{
  uint uVar1;
  Model *pMVar2;
  uint in_ECX;
  undefined4 in_register_00000034;
  long lVar3;
  ulong in_XMM0_Qa;
  float in_XMM1_Da;
  Vec3f VVar4;
  
  lVar3 = CONCAT44(in_register_00000034,fi);
  if (((-1 < li) && (in_ECX < 3)) &&
     (li < (int)((ulong)(*(long *)(lVar3 + 0x20) - *(long *)(lVar3 + 0x18)) >> 3) * -0x55555555)) {
    pMVar2 = (Model *)((long)*(int *)(*(long *)(*(long *)(lVar3 + 0x18) + (ulong)(uint)li * 0x18) +
                                      8 + (ulong)in_ECX * 0xc) * 0xc + *(long *)(lVar3 + 0x30));
    (this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined4 *)
     &(this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = 0;
    if (pMVar2 != this) {
      (this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pMVar2->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
      uVar1 = *(uint *)&(pMVar2->verts).
                        super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      in_XMM0_Qa = (ulong)uVar1;
      *(uint *)&(this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl
                .super__Vector_impl_data._M_finish = uVar1;
    }
    VVar4.z = in_XMM1_Da;
    VVar4.x = (float)(int)in_XMM0_Qa;
    VVar4.y = (float)(int)(in_XMM0_Qa >> 0x20);
    return VVar4;
  }
  __assert_fail("fi>=0 && fi<nfaces() && li>=0 && li<3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/model.cpp"
                ,0x5c,"Vec3f Model::normal(int, int)");
}

Assistant:

Vec3f Model::normal(int fi, int li) {
    assert(fi>=0 && fi<nfaces() && li>=0 && li<3);
    return norms[faces[fi][li].z];
}